

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O1

int lj_memprof_start(lua_State *L,lj_memprof_options *opt)

{
  int iVar1;
  
  if (memprof.state == MPS_IDLE) {
    memprof.saved_errno = 0;
    memprof.opt.ctx = opt->ctx;
    memprof.opt.buf = opt->buf;
    memprof.opt.len = opt->len;
    memprof.opt.writer = opt->writer;
    memprof.opt.on_stop = opt->on_stop;
    memprof.g = (global_State *)(ulong)(L->glref).ptr32;
    memprof.state = MPS_PROFILE;
    lj_wbuf_init(&memprof.out,memprof.opt.writer,memprof.opt.ctx,memprof.opt.buf,memprof.opt.len);
    lj_symtab_dump(&memprof.out,memprof.g,&memprof.lib_adds);
    lj_wbuf_addn(&memprof.out,"ljm\x03",7);
    iVar1 = lj_wbuf_test_flag(&memprof.out,'\x03');
    if (iVar1 == 0) {
      memprof.orig_alloc.allocf = lua_getallocf(L,&memprof.orig_alloc.state);
      lua_setallocf(L,memprof_allocf,memprof.orig_alloc.state);
      iVar1 = 0;
    }
    else {
      lj_memprof_start_cold_1();
      iVar1 = 4;
    }
  }
  else {
    (*opt->on_stop)(opt->ctx,opt->buf);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int lj_memprof_start(struct lua_State *L, const struct lj_memprof_options *opt)
{
  struct memprof *mp = &memprof;
  struct lj_memprof_options *mp_opt = &mp->opt;
  struct alloc *oalloc = &mp->orig_alloc;
  const size_t ljm_header_len = sizeof(ljm_header) / sizeof(ljm_header[0]);

  lj_assertL(opt->writer != NULL, "uninitialized memprof writer");
  lj_assertL(opt->on_stop != NULL, "uninitialized on stop memprof callback");
  lj_assertL(opt->buf != NULL, "uninitialized memprof writer buffer");
  lj_assertL(opt->len != 0, "bad memprof writer buffer length");

  if (mp->state != MPS_IDLE) {
    /* Clean up resources. Ignore possible errors. */
    opt->on_stop(opt->ctx, opt->buf);
    return PROFILE_ERRRUN;
  }

  /* Discard possible old errno. */
  mp->saved_errno = 0;

  /* Init options. */
  memcpy(mp_opt, opt, sizeof(*opt));

  /* Init general fields. */
  mp->g = G(L);
  mp->state = MPS_PROFILE;

  /* Init output. */
  lj_wbuf_init(&mp->out, mp_opt->writer, mp_opt->ctx, mp_opt->buf, mp_opt->len);
  lj_symtab_dump(&mp->out, mp->g, &mp->lib_adds);

  /* Write prologue. */
  lj_wbuf_addn(&mp->out, ljm_header, ljm_header_len);

  if (LJ_UNLIKELY(lj_wbuf_test_flag(&mp->out, STREAM_ERRIO|STREAM_STOP))) {
    /* on_stop call may change errno value. */
    int saved_errno = lj_wbuf_errno(&mp->out);
    /* Ignore possible errors. mp->out.buf may be NULL here. */
    mp_opt->on_stop(mp_opt->ctx, mp->out.buf);
    lj_wbuf_terminate(&mp->out);
    mp->state = MPS_IDLE;
    errno = saved_errno;
    return PROFILE_ERRIO;
  }

  /* Override allocating function. */
  oalloc->allocf = lua_getallocf(L, &oalloc->state);
  lj_assertL(oalloc->allocf != NULL, "uninitialized memprof old alloc function");
  lj_assertL(oalloc->allocf != memprof_allocf,
	     "unexpected memprof old alloc function");
  lua_setallocf(L, memprof_allocf, oalloc->state);

  return PROFILE_SUCCESS;
}